

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::~Codec(Codec *this)

{
  Codec *in_RDI;
  
  FreeWorkspace(in_RDI);
  FreeMatrix(in_RDI);
  FreeInput(in_RDI);
  return;
}

Assistant:

Codec::~Codec()
{
    FreeWorkspace();
    FreeMatrix();
    FreeInput();
}